

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

void mpp_sthd_deinit(MppSThdImpl *thd)

{
  pthread_mutex_t *__mutex;
  undefined8 in_RAX;
  undefined4 uVar1;
  undefined8 uVar2;
  
  uVar1 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((MppSThdImpl *)(thd->ctx).thd != thd) {
    uVar2 = CONCAT44(uVar1,0xdd);
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"thd->ctx.thd == thd",
               "mpp_sthd_deinit",uVar2);
    uVar1 = (undefined4)((ulong)uVar2 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001690b4;
  }
  if (1 < (int)thd->status) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
               "thd->status < MPP_STHD_RUNNING","mpp_sthd_deinit",CONCAT44(uVar1,0xde));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001690b4:
      abort();
    }
  }
  __mutex = &thd->lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  thd->status = MPP_STHD_UNINITED;
  (thd->ctx).thd = (MppSThd)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_cond_destroy((pthread_cond_t *)&thd->cond);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

static void mpp_sthd_deinit(MppSThdImpl *thd)
{
    mpp_assert(thd->ctx.thd == thd);
    mpp_assert(thd->status < MPP_STHD_RUNNING);

    pthread_mutex_lock(&thd->lock);
    thd->status = MPP_STHD_UNINITED;
    thd->ctx.thd = NULL;
    pthread_mutex_unlock(&thd->lock);

    pthread_cond_destroy(&thd->cond);
    pthread_mutex_destroy(&thd->lock);
}